

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O3

void If_ManSetupCiCutSets(If_Man_t *p)

{
  long *plVar1;
  void *pvVar2;
  bool bVar3;
  If_Set_t *pIVar4;
  long lVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  if (p->pMemCi == (If_Set_t *)0x0) {
    pVVar6 = p->vCis;
    if (pVVar6->nSize < 1) {
      bVar3 = false;
    }
    else {
      lVar7 = 0;
      do {
        If_ManSetupCutTriv(p,(If_Cut_t *)((long)pVVar6->pArray[lVar7] + 0x50),
                           *(int *)((long)pVVar6->pArray[lVar7] + 4));
        lVar7 = lVar7 + 1;
        pVVar6 = p->vCis;
      } while (lVar7 < pVVar6->nSize);
      bVar3 = 0 < pVVar6->nSize;
    }
    pIVar4 = (If_Set_t *)malloc((long)p->nObjs[2] << 5);
    p->pMemCi = pIVar4;
    if (bVar3) {
      lVar7 = 0;
      lVar5 = 0;
      do {
        pvVar2 = pVVar6->pArray[lVar5];
        pIVar4 = p->pMemCi;
        *(long *)((long)pvVar2 + 0x48) = (long)&pIVar4->nCutsMax + lVar7;
        plVar1 = (long *)((long)&pIVar4[1].nCutsMax + lVar7);
        *(undefined2 *)((long)plVar1 + -0x16) = 1;
        *(short *)(plVar1 + -3) = (short)p->pPars->nCutsMax;
        plVar1[-1] = (long)plVar1;
        *plVar1 = (long)pvVar2 + 0x50;
        lVar5 = lVar5 + 1;
        pVVar6 = p->vCis;
        lVar7 = lVar7 + 0x20;
      } while (lVar5 < pVVar6->nSize);
    }
    return;
  }
  __assert_fail("p->pMemCi == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMan.c"
                ,0x238,"void If_ManSetupCiCutSets(If_Man_t *)");
}

Assistant:

void If_ManSetupCiCutSets( If_Man_t * p )
{
    If_Obj_t * pObj;
    int i;
    assert( p->pMemCi == NULL );
    // create elementary cuts for the CIs
    If_ManForEachCi( p, pObj, i )
        If_ManSetupCutTriv( p, &pObj->CutBest, pObj->Id );
    // create elementary cutsets for the CIs
    p->pMemCi = (If_Set_t *)ABC_ALLOC( char, If_ManCiNum(p) * (sizeof(If_Set_t) + sizeof(void *)) );
    If_ManForEachCi( p, pObj, i )
    {
        pObj->pCutSet = (If_Set_t *)((char *)p->pMemCi + i * (sizeof(If_Set_t) + sizeof(void *)));
        pObj->pCutSet->nCuts = 1;
        pObj->pCutSet->nCutsMax = p->pPars->nCutsMax;
        pObj->pCutSet->ppCuts = (If_Cut_t **)(pObj->pCutSet + 1);
        pObj->pCutSet->ppCuts[0] = &pObj->CutBest;
    }
}